

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Internal.h
# Opt level: O3

int __thiscall
chatra::IdPool<chatra::Requester,_chatra::Thread>::remove
          (IdPool<chatra::Requester,_chatra::Thread> *this,char *__filename)

{
  __atomic_flag_data_type _Var1;
  iterator __position;
  char *extraout_RAX;
  char *local_18;
  KeyBaseType idBaseType;
  
  do {
    LOCK();
    _Var1 = (this->lockValues).flag.super___atomic_flag_base._M_i;
    (this->lockValues).flag.super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var1 != false);
  local_18 = __filename;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_chatra::Thread_*>,_std::allocator<std::pair<const_unsigned_long,_chatra::Thread_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->values)._M_h,&local_18);
  __position._M_current =
       (this->recycledIds).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->recycledIds).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->recycledIds,__position,
               (unsigned_long *)&local_18);
    local_18 = extraout_RAX;
  }
  else {
    *__position._M_current = (unsigned_long)local_18;
    (this->recycledIds).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  (this->lockValues).flag.super___atomic_flag_base._M_i = false;
  return (int)local_18;
}

Assistant:

void remove(KeyType id) {
		auto idBaseType = static_cast<KeyBaseType>(id);
		std::lock_guard<SpinLock> lock0(lockValues);
		values.erase(idBaseType);
		recycledIds.push_back(idBaseType);
	}